

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O2

bool __thiscall
HPack::HuffmanDecoder::decodeStream
          (HuffmanDecoder *this,BitIStream *inputStream,QByteArray *outputBuffer)

{
  quint64 qVar1;
  reference pvVar2;
  quint32 qVar3;
  ulong uVar4;
  ulong __n;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  PrefixTable table;
  PrefixTableEntry PVar7;
  quint32 chunk;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    chunk = 0;
    qVar1 = BitIStream::peekBits<unsigned_int>(inputStream,inputStream->offset,0x20,&chunk);
    uVar5 = (uint)qVar1;
    if (uVar5 == 0) {
      bVar6 = BitIStream::hasMoreBits(inputStream);
      bVar6 = !bVar6;
LAB_001d11f5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar6;
      }
      __stack_chk_fail();
    }
    if (uVar5 < this->minCodeLength) {
LAB_001d11ae:
      BitIStream::skipBits(inputStream,qVar1 & 0xffffffff);
      if (uVar5 < 8) {
        bVar6 = (-1 << ((byte)qVar1 & 0x1f) ^ chunk >> (-(byte)qVar1 & 0x1f)) == 0xffffffff;
      }
      else {
LAB_001d11f3:
        bVar6 = false;
      }
      goto LAB_001d11f5;
    }
    pvVar2 = std::vector<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>::operator[]
                       (&this->prefixTables,0);
    uVar4 = 0;
    qVar3 = chunk;
    while( true ) {
      table.prefixLength = qVar3 >> (-(char)pvVar2->indexLength & 0x1fU);
      table.indexLength = 0;
      table.offset = pvVar2->offset;
      PVar7 = tableEntry(this,table,table.prefixLength);
      __n = PVar7._0_8_ >> 0x20;
      if ((quint32)uVar4 == PVar7.nextTable) break;
      pvVar2 = std::vector<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>::operator[]
                         (&this->prefixTables,__n);
      qVar3 = chunk << ((byte)pvVar2->prefixLength & 0x1f);
      uVar4 = __n;
    }
    if (uVar5 < PVar7.bitLength) goto LAB_001d11ae;
    if ((PVar7.bitLength == 0) || (PVar7.byteValue == 0x100)) {
      BitIStream::skipBits(inputStream,qVar1 & 0xffffffff);
      goto LAB_001d11f3;
    }
    QByteArray::append((char)outputBuffer);
    BitIStream::skipBits(inputStream,PVar7._0_8_ & 0xffffffff);
  } while( true );
}

Assistant:

bool HuffmanDecoder::decodeStream(BitIStream &inputStream, QByteArray &outputBuffer)
{
    while (true) {
        quint32 chunk = 0;
        const quint32 readBits = inputStream.peekBits(inputStream.streamOffset(), 32, &chunk);
        if (!readBits)
            return !inputStream.hasMoreBits();

        if (readBits < minCodeLength) {
            inputStream.skipBits(readBits);
            return padding_is_valid(chunk, readBits);
        }

        quint32 tableIndex = 0;
        const PrefixTable *table = &prefixTables[tableIndex];
        quint32 entryIndex = chunk >> (32 - table->indexLength);
        PrefixTableEntry entry = tableEntry(*table, entryIndex);

        while (true) {
            if (entry.nextTable == tableIndex)
                break;

            tableIndex = entry.nextTable;
            table = &prefixTables[tableIndex];
            entryIndex = chunk << table->prefixLength >> (32 - table->indexLength);
            entry = tableEntry(*table, entryIndex);
        }

        if (entry.bitLength > readBits) {
            inputStream.skipBits(readBits);
            return padding_is_valid(chunk, readBits);
        }

        if (!entry.bitLength || entry.byteValue == 256) {
            //EOS (256) == compression error (HPACK).
            inputStream.skipBits(readBits);
            return false;
        }

        outputBuffer.append(entry.byteValue);
        inputStream.skipBits(entry.bitLength);
    }

    return false;
}